

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-save.c
# Opt level: O2

ztresult_t savehandler_uint(char *name,ztuint_t *pvalue,size_t nelems,size_t stride,void *opaque)

{
  ulong uVar1;
  uint uVar2;
  char *fmt;
  ulong uVar3;
  
  if (nelems == 1) {
    emitf((savestate_t *)opaque,"%s = $%X;\n",name,(ulong)*pvalue);
  }
  else {
    emitf((savestate_t *)opaque,"%s = [\n",name);
    *(int *)((long)opaque + 0xc) = *(int *)((long)opaque + 0xc) + 1;
    uVar3 = 0;
    while (uVar3 < nelems) {
      uVar1 = uVar3 + stride;
      for (; uVar3 < uVar1; uVar3 = uVar3 + 1) {
        fmt = "$%X";
        if (uVar3 < nelems - 1) {
          fmt = "$%X, ";
        }
        uVar2 = *pvalue;
        pvalue = pvalue + 1;
        emitf((savestate_t *)opaque,fmt,(ulong)uVar2);
      }
      emitf((savestate_t *)opaque,"\n");
      uVar3 = uVar1;
    }
    *(int *)((long)opaque + 0xc) = *(int *)((long)opaque + 0xc) + -1;
    emitf((savestate_t *)opaque,"];\n");
  }
  return 0;
}

Assistant:

static ztresult_t savehandler_uint(const char     *name,
                                   const ztuint_t *pvalue,
                                   size_t          nelems,
                                   size_t          stride,
                                   void           *opaque)
{
  savestate_t *state = opaque;
  DUMP(word_t);
  return ztresult_OK;
}